

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O3

void windowRefreshFun(GLFWwindow *window)

{
  vec4 *m;
  vec4 *pafVar1;
  float fVar2;
  GLfloat light_ambient [4];
  GLfloat light_specular [4];
  GLfloat light_diffuse [4];
  GLfloat light_position [4];
  vec3 center_3;
  vec3 center;
  mat4x4 view;
  float local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8 [4];
  float local_a8 [32];
  
  local_c8 = 0x4100000000000000;
  uStack_c0 = 0x3f80000041000000;
  local_d8 = 0x3f8000003f800000;
  uStack_d0 = 0x3f8000003f800000;
  local_e8 = 0x3f8000003f800000;
  uStack_e0 = 0x3f8000003f800000;
  local_f8 = 0x3e4ccccd3e4ccccd;
  uStack_f0 = 0x3f8000003e99999a;
  if (height < 1) {
    local_fc = 1.0;
  }
  else {
    local_fc = (float)width / (float)height;
  }
  glClearColor(0,0,0,0);
  glClear(0x4100);
  glEnable(0xc11);
  glEnable(0xb71);
  glDepthFunc(0x203);
  glPolygonMode(0x408,0x1b01);
  glEnable(0xb20);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(SUB84((double)local_fc * -3.0,0),(double)local_fc * 3.0,0xc008000000000000,
          0x4008000000000000,0x3ff0000000000000,0x4049000000000000);
  glViewport(0,height / 2,width / 2);
  glScissor(0,height / 2,width / 2);
  glMatrixMode(0x1700);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  m = (vec4 *)(local_a8 + 0x10);
  mat4x4_look_at(m,(float *)&DAT_0010f14c,local_a8,(float *)&DAT_0010f188);
  pafVar1 = m;
  fVar2 = (float)glLoadMatrixf();
  drawGrid(fVar2,(int)pafVar1);
  drawScene();
  glViewport(0,0,width / 2,height / 2);
  glScissor(0,0,width / 2,height / 2);
  glMatrixMode(0x1700);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  mat4x4_look_at(m,(float *)&DAT_0010f158,local_a8,(float *)&DAT_0010f188);
  pafVar1 = m;
  fVar2 = (float)glLoadMatrixf();
  drawGrid(fVar2,(int)pafVar1);
  drawScene();
  glViewport(width / 2,0,width / 2,height / 2);
  glScissor(width / 2,0,width / 2,height / 2);
  glMatrixMode(0x1700);
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  mat4x4_look_at(m,(float *)&DAT_0010f164,local_a8,(float *)&DAT_0010f188);
  pafVar1 = m;
  fVar2 = (float)glLoadMatrixf();
  drawGrid(fVar2,(int)pafVar1);
  drawScene();
  glDisable(0xb20);
  glDisable(0xbe2);
  glPolygonMode(0x408,0x1b02);
  glEnable(0xb44);
  glCullFace(0x405);
  glFrontFace(0x900);
  glMatrixMode(0x1701);
  local_a8[0] = 1.5696855 / local_fc;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 1.5696855;
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  local_a8[8] = 0.0;
  local_a8[9] = 0.0;
  local_a8[10] = -1.0408163;
  local_a8[0xb] = -1.0;
  local_a8[0xc] = 0.0;
  local_a8[0xd] = 0.0;
  local_a8[0xe] = -2.0408163;
  local_a8[0xf] = 0.0;
  glLoadMatrixf(local_a8);
  glViewport(width / 2,height / 2,width / 2);
  glScissor(width / 2,height / 2,width / 2);
  glMatrixMode(0x1700);
  local_b8[2] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  mat4x4_look_at(m,(float *)&DAT_0010f170,local_b8,(float *)&DAT_0010f188);
  glLoadMatrixf(m);
  glLightfv(0x4001,0x1203,&local_c8);
  glLightfv(0x4001,0x1200,&local_f8);
  glLightfv(0x4001,0x1201,&local_d8);
  glLightfv(0x4001,0x1202,&local_e8);
  glEnable(0x4001);
  glEnable(0xb50);
  drawScene();
  glDisable(0xb50);
  glDisable(0xb44);
  glDisable(0xb71);
  glDisable(0xc11);
  if (active_view != 2 && 0 < active_view) {
    glViewport(0,0,width,height);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0,0x4000000000000000,0,0x4000000000000000,0,0x3ff0000000000000);
    glMatrixMode(0x1700);
    glLoadIdentity();
    glTranslatef((float)(active_view - 1U & 1),
                 (float)(1 - ((active_view - ((int)(active_view - 1U) >> 0x1f)) + -1 >> 1)),0);
    glColor3f(0x3f800000,0x3f800000,0x3f19999a);
    glBegin(3);
    glVertex2i(0,0);
    glVertex2i(1,0);
    glVertex2i(1,1);
    glVertex2i(0,1);
    glVertex2i(0,0);
    glEnd();
  }
  glfwSwapBuffers(window);
  do_redraw = 1;
  return;
}

Assistant:

static void windowRefreshFun(GLFWwindow* window)
{
    drawAllViews();
    glfwSwapBuffers(window);
    do_redraw = 0;
}